

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

bool __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::regionContained(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                  *this,int *searchMin,int *searchMax,int *regionMin,int *regionMax)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if ((uVar2 == 5) || (regionMin[uVar2] < searchMin[uVar2])) break;
    uVar1 = uVar2 + 1;
  } while (regionMax[uVar2] <= searchMax[uVar2]);
  return 4 < uVar2;
}

Assistant:

bool regionContained(const T * const searchMin, const T * const searchMax, const T * const regionMin, const T * const regionMax) const {
			for (int d = 0; d < dim; d++) {
				if (LESS()(regionMin, searchMin, d)
					|| LESS()(searchMax, regionMax, d)) {
					return false;
				}
			}
			return true;
		}